

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

int read_cached_features(vw *all,v_array<example_*> *examples)

{
  byte bVar1;
  example *ae;
  io_buf *piVar2;
  vw *pvVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ostream *poVar7;
  char cVar8;
  int iVar9;
  features *this;
  char *pcVar10;
  feature_index i_00;
  bool bVar11;
  feature_value v;
  char *c;
  feature_index i;
  size_t local_50;
  features *local_48;
  io_buf *local_40;
  vw *local_38;
  
  ae = *examples->_begin;
  ae->sorted = all->p->sorted_cache;
  piVar2 = all->p->input;
  sVar4 = (*(all->p->lp).read_cached_label)(all->sd,&ae->l,piVar2);
  iVar9 = 0;
  if (sVar4 != 0) {
    sVar5 = read_cached_tag(piVar2,ae);
    if (sVar5 != 0) {
      sVar5 = io_buf::buf_read(piVar2,&c,1);
      if (sVar5 == 0) {
LAB_001f9f95:
        iVar9 = 0;
      }
      else {
        cVar8 = *c;
        c = c + 1;
        all->p->input->head = c;
        local_48 = (ae->super_example_predict).feature_space;
        local_50 = sVar4;
        local_40 = piVar2;
        local_38 = all;
        while( true ) {
          pvVar3 = local_38;
          piVar2 = local_40;
          bVar11 = cVar8 == '\0';
          cVar8 = cVar8 + -1;
          if (bVar11) break;
          sVar4 = io_buf::buf_read(local_40,&c,9);
          if (sVar4 < 9) {
            poVar7 = std::operator<<(&(pvVar3->trace_message).super_ostream,"truncated example! ");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            poVar7 = std::operator<<(poVar7," ");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
LAB_001f9f8d:
            std::endl<char,std::char_traits<char>>(poVar7);
            goto LAB_001f9f95;
          }
          bVar1 = *c;
          c = c + 1;
          i = CONCAT71(i._1_7_,bVar1);
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ae,(uchar *)&i);
          uVar6 = *(ulong *)c;
          c = c + 8;
          pvVar3->p->input->head = c;
          sVar4 = io_buf::buf_read(piVar2,&c,uVar6);
          if (sVar4 < uVar6) {
            poVar7 = std::operator<<(&(pvVar3->trace_message).super_ostream,
                                     "truncated example! wanted: ");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            poVar7 = std::operator<<(poVar7," bytes");
            goto LAB_001f9f8d;
          }
          this = local_48 + bVar1;
          local_50 = local_50 + uVar6;
          pcVar10 = c + uVar6;
          i_00 = 0;
          while (c != pcVar10) {
            i = 0;
            c = run_len_decode(c,&i);
            v = -1.0;
            if (((i & 1) == 0) && (v = 1.0, (i & 2) != 0)) {
              v = *(feature_value *)c;
              c = (char *)((long)c + 4);
            }
            uVar6 = (long)(i << 0x3d) >> 0x3f;
            if ((long)uVar6 < 0) {
              ae->sorted = false;
            }
            i_00 = i_00 + (uVar6 ^ i >> 3);
            i = i_00;
            features::push_back(this,v,i_00);
          }
          local_38->p->input->head = c;
        }
        iVar9 = (int)local_50;
      }
    }
  }
  return iVar9;
}

Assistant:

int read_cached_features(vw* all, v_array<example*>& examples)
{
  example* ae = examples[0];
  ae->sorted = all->p->sorted_cache;
  io_buf* input = all->p->input;

  size_t total = all->p->lp.read_cached_label(all->sd, &ae->l, *input);
  if (total == 0)
    return 0;
  if (read_cached_tag(*input, ae) == 0)
    return 0;
  char* c;
  unsigned char num_indices = 0;
  if (input->buf_read(c, sizeof(num_indices)) < sizeof(num_indices))
    return 0;
  num_indices = *(unsigned char*)c;
  c += sizeof(num_indices);

  all->p->input->set(c);
  for (; num_indices > 0; num_indices--)
  {
    size_t temp;
    unsigned char index = 0;
    if ((temp = input->buf_read(c, sizeof(index) + sizeof(size_t))) < sizeof(index) + sizeof(size_t))
    {
      all->trace_message << "truncated example! " << temp << " " << char_size + sizeof(size_t) << endl;
      return 0;
    }

    index = *(unsigned char*)c;
    c += sizeof(index);
    ae->indices.push_back((size_t)index);
    features& ours = ae->feature_space[index];
    size_t storage = *(size_t*)c;
    c += sizeof(size_t);
    all->p->input->set(c);
    total += storage;
    if (input->buf_read(c, storage) < storage)
    {
      all->trace_message << "truncated example! wanted: " << storage << " bytes" << endl;
      return 0;
    }

    char* end = c + storage;

    uint64_t last = 0;

    for (; c != end;)
    {
      feature_index i = 0;
      c = run_len_decode(c, i);
      feature_value v = 1.f;
      if (i & neg_1)
        v = -1.;
      else if (i & general)
      {
        v = ((one_float*)c)->f;
        c += sizeof(float);
      }
      uint64_t diff = i >> 2;
      int64_t s_diff = ZigZagDecode(diff);
      if (s_diff < 0)
        ae->sorted = false;
      i = last + s_diff;
      last = i;
      ours.push_back(v, i);
    }
    all->p->input->set(c);
  }

  return (int)total;
}